

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenTypeFileInput.cpp
# Opt level: O0

unsigned_long __thiscall OpenTypeFileInput::GetTag(OpenTypeFileInput *this,char *inTagName)

{
  size_t sVar1;
  ushort local_1e;
  byte local_1c [4];
  unsigned_short i;
  char *pcStack_18;
  Byte buffer [4];
  char *inTagName_local;
  OpenTypeFileInput *this_local;
  
  pcStack_18 = inTagName;
  for (local_1e = 0; sVar1 = strlen(pcStack_18), local_1e < sVar1; local_1e = local_1e + 1) {
    local_1c[local_1e] = pcStack_18[local_1e];
  }
  for (; local_1e < 4; local_1e = local_1e + 1) {
    local_1c[local_1e] = 0x20;
  }
  return (ulong)local_1c[0] * 0x1000000 + (ulong)local_1c[1] * 0x10000 + (ulong)local_1c[2] * 0x100
         + (ulong)local_1c[3];
}

Assistant:

unsigned long OpenTypeFileInput::GetTag(const char* inTagName)

{
	Byte buffer[4];
	unsigned short i=0;

	for(; i<strlen(inTagName);++i)
		buffer[i] = (Byte)inTagName[i];
	for(;i<4;++i)
		buffer[i] = 0x20;

	return	((unsigned long)buffer[0]<<24) + ((unsigned long)buffer[1]<<16) + 
			((unsigned long)buffer[2]<<8) + buffer[3];
}